

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O1

void __thiscall t_c_glib_generator::close_generator(t_c_glib_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  pointer pcVar1;
  ostream *poVar2;
  int __fd;
  _Alloc_hider _Var3;
  string program_name_uc;
  string local_78;
  string local_58;
  string local_38;
  
  pcVar1 = (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,
             pcVar1 + (this->super_t_oop_generator).super_t_generator.program_name_._M_string_length
            );
  initial_caps_to_underscores(&local_38,&local_58);
  to_upper_case(&local_78,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  this_00 = &this->f_types_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#endif /* ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,(this->nspace_uc)._M_dataplus._M_p,
                      (this->nspace_uc)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_TYPES_H */",0xb);
  _Var3 = ::endl_abi_cxx11_._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  __fd = (int)_Var3._M_p;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_impl_,__fd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_c_glib_generator::close_generator() {
  string program_name_uc = to_upper_case(initial_caps_to_underscores(program_name_));

  /* end the header inclusion guard */
  f_types_ << "#endif /* " << this->nspace_uc << program_name_uc << "_TYPES_H */" << endl;

  /* close output file */
  f_types_.close();
  f_types_impl_.close();
}